

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O1

bool __thiscall tinyusdz::crate::CrateReader::ReadTimeSamples(CrateReader *this,TimeSamples *d)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  StreamReader *pSVar2;
  char cVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  bool bVar8;
  long *plVar9;
  ostream *poVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  undefined8 this_00;
  storage_union *psVar17;
  char *pcVar18;
  undefined8 __return_storage_ptr__;
  anon_struct_8_0_00000001_for___align aVar19;
  uint __len;
  optional<std::vector<double,_std::allocator<double>_>_> pv;
  int64_t offset;
  CrateValue value;
  ValueRep rep;
  vector<double,_std::allocator<double>_> times;
  uint64_t num_values;
  ValueRep times_rep;
  CrateValue times_value;
  ostringstream ss_e;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  long *local_260;
  ulong local_258;
  storage_union local_250;
  undefined **local_240 [2];
  string *local_230;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long local_1f8;
  long *local_1e8 [2];
  long local_1d8 [2];
  ValueRep local_1c8;
  storage_union local_1c0;
  undefined **local_1b0;
  ostringstream local_1a8 [8];
  storage_t<std::vector<double,_std::allocator<double>_>_> local_1a0 [4];
  ios_base local_138 [264];
  
  local_258 = 0;
  bVar8 = StreamReader::read8(this->_sr,(int64_t *)&local_258);
  if (bVar8) {
    pSVar2 = this->_sr;
    uVar12 = (local_258 + pSVar2->idx_) - 8;
    if ((-1 < (long)uVar12) && ((ulong)uVar12 <= pSVar2->length_)) {
      pSVar2->idx_ = uVar12;
      local_1c8.data = 0;
      bVar8 = ReadValueRep(this,&local_1c8);
      if (!bVar8) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadTimeSamples",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x344);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        pcVar18 = "Failed to read ValueRep for TimeSample\' `times` element.";
        lVar16 = 0x38;
        goto LAB_001a5f42;
      }
      plVar9 = (long *)this->_sr->idx_;
      local_1b0 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_1c0.dynamic = (void *)0x0;
      bVar8 = UnpackValueRep(this,&local_1c8,(CrateValue *)&local_1c0);
      if (!bVar8) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadTimeSamples",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x357);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to unpack value of TimeSample\'s `times` element.",
                   0x37);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_280._0_8_ != &local_270) {
          operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
        bVar8 = false;
        goto LAB_001a6b58;
      }
      local_208._M_allocated_capacity = 0;
      local_208._8_8_ = 0;
      local_1f8 = 0;
      __return_storage_ptr__ = local_1a8;
      this_00 = &local_1c0;
      tinyusdz::value::Value::get_value<std::vector<double,std::allocator<double>>>
                ((optional<std::vector<double,_std::allocator<double>_>_> *)__return_storage_ptr__,
                 (Value *)this_00,false);
      uVar6 = local_1a0[0]._16_8_;
      uVar5 = local_1a0[0]._8_8_;
      uVar4 = local_1a0[0].data._0_8_;
      if (local_1a8[0] == (ostringstream)0x1) {
        local_1a0[0].data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_1a0[0]._8_8_ = 0;
        local_1a0[0]._16_8_ = (storage_union *)0x0;
        uVar12 = uVar5;
        this_00 = uVar6;
        __return_storage_ptr__ = uVar4;
      }
      local_280[0] = (char)local_1a8[0];
      psVar17 = (storage_union *)this_00;
      aVar19 = (anon_struct_8_0_00000001_for___align)__return_storage_ptr__;
      if (local_1a8[0] != (ostringstream)0x0) {
        psVar17 = (storage_union *)0x0;
        aVar19 = (anon_struct_8_0_00000001_for___align)0x0;
        local_280._8_8_ = __return_storage_ptr__;
        local_270._M_allocated_capacity = uVar12;
        local_270._8_8_ = this_00;
      }
      if (((byte)local_1a8[0] & aVar19 != (anon_struct_8_0_00000001_for___align)0x0) == 1) {
        operator_delete((void *)aVar19,(long)psVar17 - (long)aVar19);
      }
      cVar3 = local_280[0];
      if (local_280[0] == '\x01') {
        ::std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)&local_208,
                   (vector<double,_std::allocator<double>_> *)(local_280 + 8));
      }
      else {
        local_260 = plVar9;
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ReadTimeSamples",0xf);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x362);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
        local_1e8[0] = local_1d8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,
                   "`times` in TimeSamples must be type `double[]`, but got type `{}`","");
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_228 + 0x10);
        pbVar15 = pbVar1;
        if (local_1b0 == (undefined **)0x0) {
          local_228._16_4_ = 0x64696f76;
          local_228._8_8_ = 4;
          local_228._20_4_ = local_228._20_4_ & 0xffffff00;
          local_228._0_8_ = pbVar1;
        }
        else {
          (*(code *)local_1b0[2])((string *)local_228);
        }
        fmt::format<std::__cxx11::string>
                  ((string *)&local_250,(fmt *)local_1e8,(string *)local_228,pbVar15);
        poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(char *)local_250.dynamic,local_250._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        if ((undefined ***)local_250.dynamic != local_240) {
          operator_delete(local_250.dynamic,(long)local_240[0] + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_ !=
            pbVar1) {
          operator_delete((void *)local_228._0_8_,CONCAT44(local_228._20_4_,local_228._16_4_) + 1);
        }
        plVar9 = local_260;
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_250.dynamic);
        if ((undefined ***)local_250.dynamic != local_240) {
          operator_delete(local_250.dynamic,(long)local_240[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      if ((local_280[0] == '\x01') &&
         ((anon_struct_8_0_00000001_for___align)local_280._8_8_ !=
          (anon_struct_8_0_00000001_for___align)0x0)) {
        operator_delete((void *)local_280._8_8_,local_270._8_8_ - local_280._8_8_);
      }
      if (cVar3 == '\0') {
LAB_001a6b39:
        bVar8 = false;
      }
      else {
        pSVar2 = this->_sr;
        if ((long *)pSVar2->length_ < plVar9) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x36b);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar18 = "Failed to seek to TimeSamples values.";
          lVar16 = 0x25;
LAB_001a6ab7:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
LAB_001a6b01:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &local_270) {
LAB_001a6b0b:
            operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
          }
LAB_001a6b18:
          ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
          ::std::ios_base::~ios_base(local_138);
          goto LAB_001a6b39;
        }
        pSVar2->idx_ = (uint64_t)plVar9;
        bVar8 = StreamReader::read8(pSVar2,(int64_t *)&local_258);
        if (!bVar8) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x371);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar18 = "Failed to read the offset for value in TimeSamples.";
          lVar16 = 0x33;
          goto LAB_001a6ab7;
        }
        pSVar2 = this->_sr;
        uVar11 = (local_258 + pSVar2->idx_) - 8;
        if (((long)uVar11 < 0) || (pSVar2->length_ < uVar11)) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x37a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          ::std::__cxx11::to_string((string *)&local_250,local_258);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_280,"Failed to seek to TimeSample values. Invalid offset value: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_250);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(char *)local_280._0_8_,local_280._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &local_270) {
            operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
          }
          if ((undefined ***)local_250.dynamic != local_240) {
            operator_delete(local_250.dynamic,(long)local_240[0] + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._0_8_ != &local_270) goto LAB_001a6b0b;
          goto LAB_001a6b18;
        }
        pSVar2->idx_ = uVar11;
        local_1e8[0] = (long *)0x0;
        bVar8 = StreamReader::read8(pSVar2,(uint64_t *)local_1e8);
        if (!bVar8) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x37f);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar18 = "Failed to read the number of values from TimeSamples.";
          lVar16 = 0x35;
          goto LAB_001a6ab7;
        }
        if ((long *)((long)(local_208._8_8_ - local_208._0_8_) >> 3) != local_1e8[0]) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x386);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar18 = "# of `times` elements and # of values in Crate differs.";
          lVar16 = 0x37;
          goto LAB_001a6ab7;
        }
        if (local_1e8[0] != (long *)0x0) {
          local_230 = &this->_err;
          local_260 = (long *)0x0;
          do {
            bVar8 = ReadValueRep(this,(ValueRep *)local_228);
            if (!bVar8) {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadTimeSamples",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x38d);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Failed to read ValueRep for TimeSample\' value element.",0x36);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)local_230,local_280._0_8_);
              goto LAB_001a6b01;
            }
            uVar11 = this->_sr->idx_;
            local_240[0] = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
            local_250.dynamic = (undefined ***)0x0;
            bVar8 = UnpackValueRep(this,(ValueRep *)local_228,(CrateValue *)&local_250);
            if (bVar8) {
              tinyusdz::value::TimeSamples::add_sample
                        (d,*(double *)(local_208._M_allocated_capacity + (long)local_260 * 8),
                         (Value *)&local_250);
              if (uVar11 <= this->_sr->length_) {
                this->_sr->idx_ = uVar11;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReadTimeSamples",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x397);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "Failed to unpack value of TimeSample\'s value element.",0x35);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::_M_append((char *)local_230,local_280._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_280._0_8_ != &local_270) {
                operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
              ::std::ios_base::~ios_base(local_138);
            }
            if (local_240[0] != (undefined **)0x0) {
              (*(code *)local_240[0][4])(&local_250);
              local_240[0] = (undefined **)0x0;
            }
            if (!bVar8) goto LAB_001a6b39;
            local_260 = (long *)((long)local_260 + 1);
          } while (local_260 < local_1e8[0]);
        }
        pSVar2 = this->_sr;
        if (plVar9 <= (long *)pSVar2->length_) {
          pSVar2->idx_ = (uint64_t)plVar9;
        }
        uVar11 = (long)local_1e8[0] * 8 + pSVar2->idx_;
        if (((long)uVar11 < 0) || (pSVar2->length_ < uVar11)) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ReadTimeSamples",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x3a5);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar18 = "Failed to seek over TimeSamples\'s values.";
          lVar16 = 0x29;
          goto LAB_001a6ab7;
        }
        pSVar2->idx_ = uVar11;
        bVar8 = true;
      }
      if ((void *)local_208._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_208._M_allocated_capacity,local_1f8 - local_208._0_8_);
      }
LAB_001a6b58:
      if (local_1b0 == (undefined **)0x0) {
        return bVar8;
      }
      (*(code *)local_1b0[4])(&local_1c0);
      return bVar8;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x33d);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    uVar11 = -local_258;
    if (0 < (long)local_258) {
      uVar11 = local_258;
    }
    __len = 1;
    if (9 < uVar11) {
      uVar13 = uVar11;
      uVar7 = 4;
      do {
        __len = uVar7;
        if (uVar13 < 100) {
          __len = __len - 2;
          goto LAB_001a62fd;
        }
        if (uVar13 < 1000) {
          __len = __len - 1;
          goto LAB_001a62fd;
        }
        if (uVar13 < 10000) goto LAB_001a62fd;
        bVar8 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        uVar7 = __len + 4;
      } while (bVar8);
      __len = __len + 1;
    }
LAB_001a62fd:
    lVar16 = (long)local_258 >> 0x3f;
    local_250.dynamic = local_240;
    ::std::__cxx11::string::_M_construct
              ((ulong)&local_250,(char)__len - (char)((long)local_258 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_250._0_8_ - lVar16),__len,uVar11);
    plVar9 = (long *)::std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x3b77e6);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar14) {
      local_270._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_270._8_8_ = plVar9[3];
      local_280._0_8_ = &local_270;
    }
    else {
      local_270._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_280._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_280._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar9 + 1);
    *plVar9 = (long)paVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(char *)local_280._0_8_,local_280._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
    }
    if ((undefined ***)local_250.dynamic != local_240) {
      operator_delete(local_250.dynamic,(long)local_240[0] + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ == &local_270) goto LAB_001a5fa3;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTimeSamples",0xf)
    ;
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar10 = (ostream *)::std::ostream::operator<<(local_1a8,0x333);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
    pcVar18 = "Failed to read the offset for value in Dictionary.";
    lVar16 = 0x32;
LAB_001a5f42:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,lVar16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,local_280._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ == &local_270) goto LAB_001a5fa3;
  }
  operator_delete((void *)local_280._0_8_,local_270._M_allocated_capacity + 1);
LAB_001a5fa3:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadTimeSamples(value::TimeSamples *d) {

  // Layout
  //
  // - `times`(double[])
  // - NumValueReps(int64)
  // - ArrayOfValueRep
  //

  // TODO(syoyo): Deferred loading of TimeSamples?(See USD's implementation for details)

  DCOUT("ReadTimeSamples: offt before tell = " << _sr->tell());

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // https://github.com/PixarAnimationStudios/USD/blob/release/pxr/usd/usd/crateFile.cpp for details.
  int64_t offset{0};
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in Dictionary.");
    return false;
  }

  DCOUT("TimeSample times value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample times. Invalid offset value: " +
            std::to_string(offset));
  }

  // TODO(syoyo): Deduplicate times?

  crate::ValueRep times_rep{0};
  if (!ReadValueRep(&times_rep)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' `times` element.");
  }

  // Save offset
  auto values_offset = _sr->tell();

  // TODO: Enable Check if  type `double[]`
#if 0
  if (times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR) {
    // ok
  } else if ((times_rep.GetType() == crate::CrateDataTypeId::CRATE_DATA_TYPE_DOUBOLE) && times_rep.IsArray()) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` value must be type `double[]`, but got type `{}`", times_rep.GetTypeName()));
  }
#endif

  crate::CrateValue times_value;
  if (!UnpackValueRep(times_rep, &times_value)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's `times` element.");
  }

  // must be an array of double.
  DCOUT("TimeSample times:" << times_value.type_name());

  std::vector<double> times;
  if (auto pv = times_value.get_value<std::vector<double>>()) {
    times = pv.value();
    DCOUT("`times` = " << times);
  } else {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("`times` in TimeSamples must be type `double[]`, but got type `{}`", times_value.type_name()));
  }

  //
  // Parse values(elements) of TimeSamples.
  //

  // seek position will be changed in `_UnpackValueRep`, so revert it.
  if (!_sr->seek_set(values_offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSamples values.");
  }

  // 8byte for the offset for recursive value. See RecursiveRead() in
  // crateFile.cpp for details.
  if (!_sr->read8(&offset)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the offset for value in TimeSamples.");
    return false;
  }

  DCOUT("TimeSample value offset = " << offset);
  DCOUT("TimeSample tell = " << _sr->tell());

  // -8 to compensate sizeof(offset)
  if (!_sr->seek_from_current(offset - 8)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek to TimeSample values. Invalid offset value: " + std::to_string(offset));
  }

  uint64_t num_values{0};
  if (!_sr->read8(&num_values)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read the number of values from TimeSamples.");
    return false;
  }

  DCOUT("Number of values = " << num_values);

  if (times.size() != num_values) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "# of `times` elements and # of values in Crate differs.");
  }

  for (size_t i = 0; i < num_values; i++) {

    crate::ValueRep rep;
    if (!ReadValueRep(&rep)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read ValueRep for TimeSample' value element.");
    }

    auto next_vrep_loc = _sr->tell();

    ///
    /// Type check of the content of `value` will be done at ReconstructPrim() in usdc-reader.cc.
    ///
    crate::CrateValue value;
    if (!UnpackValueRep(rep, &value)) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to unpack value of TimeSample's value element.");
    }

    d->add_sample(times[i], value.get_raw());

    // UnpackValueRep() will change StreamReader's read position.
    // Revert to next ValueRep location here.
    _sr->seek_set(next_vrep_loc);
  }

  // Move to next location.
  // sizeof(uint64) = sizeof(ValueRep)
  _sr->seek_set(values_offset);
  if (!_sr->seek_from_current(int64_t(sizeof(uint64_t) * num_values))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to seek over TimeSamples's values.");
  }


  return true;
}